

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

void miIntersectO(QRegionPrivate *dest,QRect *r1,QRect *r1End,QRect *r2,QRect *r2End,int y1,int y2)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long size;
  qsizetype qVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  QRect *pNextRect;
  int x2;
  int x1;
  QList<QRect> *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar5;
  long local_38;
  long local_28;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QRect>::data(in_stack_ffffffffffffff90);
  local_38 = in_RCX;
  local_28 = in_RSI;
  while (uVar5 = local_28 != in_RDX && local_38 != in_R8, local_28 != in_RDX && local_38 != in_R8) {
    local_c = QRect::left((QRect *)0x656e56);
    local_10 = QRect::left((QRect *)0x656e64);
    piVar3 = qMax<int>(&local_c,&local_10);
    iVar1 = *piVar3;
    local_14 = QRect::right((QRect *)0x656e87);
    local_18 = QRect::right((QRect *)0x656e95);
    piVar3 = qMin<int>(&local_14,&local_18);
    if (iVar1 <= *piVar3) {
      size = (long)*in_RDI;
      qVar4 = QList<QRect>::size((QList<QRect> *)(in_RDI + 2));
      if (qVar4 + -1 <= size) {
        in_stack_ffffffffffffff90 = (QList<QRect> *)(in_RDI + 2);
        QList<QRect>::size((QList<QRect> *)(in_RDI + 2));
        QList<QRect>::resize((QList<QRect> *)CONCAT17(uVar5,in_stack_ffffffffffffffa0),size);
        QList<QRect>::data(in_stack_ffffffffffffff90);
      }
      QRect::setCoords((QRect *)CONCAT17(uVar5,in_stack_ffffffffffffffa0),(int)((ulong)size >> 0x20)
                       ,(int)size,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                       (int)in_stack_ffffffffffffff90);
      *in_RDI = *in_RDI + 1;
    }
    iVar1 = QRect::right((QRect *)0x656f78);
    iVar2 = QRect::right((QRect *)0x656f86);
    if (iVar1 < iVar2) {
      local_28 = local_28 + 0x10;
    }
    else {
      iVar1 = QRect::right((QRect *)0x656faa);
      iVar2 = QRect::right((QRect *)0x656fb7);
      if (iVar2 <= iVar1) {
        local_28 = local_28 + 0x10;
      }
      local_38 = local_38 + 0x10;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void miIntersectO(QRegionPrivate &dest, const QRect *r1, const QRect *r1End,
                         const QRect *r2, const QRect *r2End, int y1, int y2)
{
    int x1;
    int x2;
    QRect *pNextRect;

    pNextRect = dest.rects.data() + dest.numRects;

    while (r1 != r1End && r2 != r2End) {
        x1 = qMax(r1->left(), r2->left());
        x2 = qMin(r1->right(), r2->right());

        /*
         * If there's any overlap between the two rectangles, add that
         * overlap to the new region.
         * There's no need to check for subsumption because the only way
         * such a need could arise is if some region has two rectangles
         * right next to each other. Since that should never happen...
         */
        if (x1 <= x2) {
            Q_ASSERT(y1 <= y2);
            MEMCHECK(dest, pNextRect, dest.rects)
            pNextRect->setCoords(x1, y1, x2, y2);
            ++dest.numRects;
            ++pNextRect;
        }

        /*
         * Need to advance the pointers. Shift the one that extends
         * to the right the least, since the other still has a chance to
         * overlap with that region's next rectangle, if you see what I mean.
         */
        if (r1->right() < r2->right()) {
            ++r1;
        } else if (r2->right() < r1->right()) {
            ++r2;
        } else {
            ++r1;
            ++r2;
        }
    }
}